

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroker_outside(PVG_FT_Stroker stroker,PVG_FT_Int side,PVG_FT_Fixed line_length)

{
  PVG_FT_StrokeBorder border_00;
  long lVar1;
  PVG_FT_Angle PVar2;
  PVG_FT_Pos PVar3;
  PVG_FT_Long PVar4;
  bool bVar5;
  bool bVar6;
  undefined1 local_b8 [8];
  PVG_FT_Vector delta_2;
  PVG_FT_Fixed length;
  PVG_FT_Fixed coef;
  PVG_FT_Vector delta_1;
  PVG_FT_Vector middle;
  PVG_FT_Vector delta;
  PVG_FT_Bool fixed_bevel;
  long lStack_60;
  PVG_FT_Bool bevel;
  PVG_FT_Angle phi;
  PVG_FT_Angle theta;
  PVG_FT_Vector sigma;
  PVG_FT_Fixed radius;
  PVG_FT_Angle rotate;
  PVG_FT_Error error;
  PVG_FT_StrokeBorder border;
  PVG_FT_Fixed line_length_local;
  PVG_FT_Int side_local;
  PVG_FT_Stroker stroker_local;
  
  border_00 = stroker->borders + side;
  if (stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND) {
    rotate._4_4_ = ft_stroker_arcto(stroker,side);
  }
  else {
    sigma.y = stroker->radius;
    memset(&theta,0,0x10);
    lStack_60 = 0;
    lVar1 = (long)side * -0xb40000 + 0x5a0000;
    bVar5 = stroker->line_join == PVG_FT_STROKER_LINEJOIN_BEVEL;
    bVar6 = stroker->line_join != PVG_FT_STROKER_LINEJOIN_MITER;
    if (!bVar5) {
      PVar2 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
      phi = PVar2 / 2;
      if (phi == 0x5a0000) {
        phi = -lVar1;
      }
      lStack_60 = stroker->angle_in + phi + lVar1;
      PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&theta,stroker->miter_limit,phi);
      if ((theta < 0x10000) && ((bVar6 || (PVar3 = ft_pos_abs(phi), 0x39 < PVar3)))) {
        bVar5 = true;
      }
    }
    if (bVar5) {
      if (bVar6) {
        PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&middle.y,sigma.y,stroker->angle_out + lVar1);
        middle.y = (stroker->center).x + middle.y;
        border_00->movable = '\0';
        rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)&middle.y,'\0');
      }
      else {
        PVar4 = PVG_FT_MulFix(sigma.y,stroker->miter_limit);
        PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&delta_1.y,PVar4,lStack_60);
        PVar4 = PVG_FT_DivFix(0x10000 - theta,sigma.x);
        coef = PVG_FT_MulFix(middle.x,PVar4);
        PVar4 = PVG_FT_MulFix(-delta_1.y,PVar4);
        delta_1.y = (stroker->center).x + delta_1.y;
        middle.x = (stroker->center).y + middle.x;
        coef = delta_1.y + coef;
        delta_1.x = middle.x + PVar4;
        rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)&coef,'\0');
        if (rotate._4_4_ == 0) {
          coef = delta_1.y * 2 - coef;
          delta_1.x = middle.x * 2 - delta_1.x;
          rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)&coef,'\0');
          if ((rotate._4_4_ == 0) && (line_length == 0)) {
            PVG_FT_Vector_From_Polar((PVG_FT_Vector *)&coef,sigma.y,stroker->angle_out + lVar1);
            coef = (stroker->center).x + coef;
            delta_1.x = (stroker->center).y + delta_1.x;
            rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)&coef,'\0');
          }
        }
      }
    }
    else {
      delta_2.y = PVG_FT_MulDiv(stroker->radius,stroker->miter_limit,theta);
      PVG_FT_Vector_From_Polar((PVG_FT_Vector *)local_b8,delta_2.y,lStack_60);
      local_b8 = (undefined1  [8])((stroker->center).x + (long)local_b8);
      delta_2.x = (stroker->center).y + delta_2.x;
      rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)local_b8,'\0');
      if ((rotate._4_4_ == 0) && (line_length == 0)) {
        PVG_FT_Vector_From_Polar
                  ((PVG_FT_Vector *)local_b8,stroker->radius,stroker->angle_out + lVar1);
        local_b8 = (undefined1  [8])((stroker->center).x + (long)local_b8);
        delta_2.x = (stroker->center).y + delta_2.x;
        rotate._4_4_ = ft_stroke_border_lineto(border_00,(PVG_FT_Vector *)local_b8,'\0');
      }
    }
  }
  return rotate._4_4_;
}

Assistant:

static PVG_FT_Error
ft_stroker_outside( PVG_FT_Stroker  stroker,
                    PVG_FT_Int      side,
                    PVG_FT_Fixed    line_length )
{
    PVG_FT_StrokeBorder  border = stroker->borders + side;
    PVG_FT_Error         error;
    PVG_FT_Angle         rotate;


    if ( stroker->line_join == PVG_FT_STROKER_LINEJOIN_ROUND )
      error = ft_stroker_arcto( stroker, side );
    else
    {
      /* this is a mitered (pointed) or beveled (truncated) corner */
      PVG_FT_Fixed   radius = stroker->radius;
      PVG_FT_Vector  sigma = {0, 0};
      PVG_FT_Angle   theta = 0, phi = 0;
      PVG_FT_Bool    bevel, fixed_bevel;


      rotate = PVG_FT_SIDE_TO_ROTATE( side );

      bevel =
        PVG_FT_BOOL( stroker->line_join == PVG_FT_STROKER_LINEJOIN_BEVEL );

      fixed_bevel =
        PVG_FT_BOOL( stroker->line_join != PVG_FT_STROKER_LINEJOIN_MITER_VARIABLE );

      /* check miter limit first */
      if ( !bevel )
      {
        theta = PVG_FT_Angle_Diff( stroker->angle_in, stroker->angle_out ) / 2;

        if ( theta == PVG_FT_ANGLE_PI2 )
          theta = -rotate;

        phi    = stroker->angle_in + theta + rotate;

        PVG_FT_Vector_From_Polar( &sigma, stroker->miter_limit, theta );

        /* is miter limit exceeded? */
        if ( sigma.x < 0x10000L )
        {
          /* don't create variable bevels for very small deviations; */
          /* FT_Sin(x) = 0 for x <= 57                               */
          if ( fixed_bevel || ft_pos_abs( theta ) > 57 )
            bevel = TRUE;
        }
      }

      if ( bevel )  /* this is a bevel (broken angle) */
      {
        if ( fixed_bevel )
        {
          /* the outer corners are simply joined together */
          PVG_FT_Vector  delta;


          /* add bevel */
          PVG_FT_Vector_From_Polar( &delta,
                                radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          border->movable = FALSE;
          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
        else /* variable bevel or clipped miter */
        {
          /* the miter is truncated */
          PVG_FT_Vector  middle, delta;
          PVG_FT_Fixed   coef;


          /* compute middle point and first angle point */
          PVG_FT_Vector_From_Polar( &middle,
                                   PVG_FT_MulFix( radius, stroker->miter_limit ),
                                   phi );

          coef    = PVG_FT_DivFix(  0x10000L - sigma.x, sigma.y );
          delta.x = PVG_FT_MulFix(  middle.y, coef );
          delta.y = PVG_FT_MulFix( -middle.x, coef );

          middle.x += stroker->center.x;
          middle.y += stroker->center.y;
          delta.x  += middle.x;
          delta.y  += middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* compute second angle point */
          delta.x = middle.x - delta.x + middle.x;
          delta.y = middle.y - delta.y + middle.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
          if ( error )
            goto Exit;

          /* finally, add an end point; only needed if not lineto */
          /* (line_length is zero for curves)                     */
          if ( line_length == 0 )
          {
            PVG_FT_Vector_From_Polar( &delta,
                                  radius,
                                  stroker->angle_out + rotate );

            delta.x += stroker->center.x;
            delta.y += stroker->center.y;

            error = ft_stroke_border_lineto( border, &delta, FALSE );
          }
        }
      }
      else /* this is a miter (intersection) */
      {
        PVG_FT_Fixed   length;
        PVG_FT_Vector  delta;


        length = PVG_FT_MulDiv( stroker->radius, stroker->miter_limit, sigma.x );

        PVG_FT_Vector_From_Polar( &delta, length, phi );
        delta.x += stroker->center.x;
        delta.y += stroker->center.y;

        error = ft_stroke_border_lineto( border, &delta, FALSE );
        if ( error )
          goto Exit;

        /* now add an end point; only needed if not lineto */
        /* (line_length is zero for curves)                */
        if ( line_length == 0 )
        {
          PVG_FT_Vector_From_Polar( &delta,
                                stroker->radius,
                                stroker->angle_out + rotate );
          delta.x += stroker->center.x;
          delta.y += stroker->center.y;

          error = ft_stroke_border_lineto( border, &delta, FALSE );
        }
      }
    }

  Exit:
    return error;
}